

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

uint __thiscall antlr::TokenBuffer::mark(TokenBuffer *this)

{
  iterator __first;
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = (ulong)this->numToConsume;
  if (uVar4 != 0) {
    if (this->nMarkers == 0) {
      __first._M_current =
           (this->queue).storage.
           super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (this->queue).m_offset;
      uVar2 = ((long)(this->queue).storage.
                     super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__first._M_current >> 3) -
              uVar1;
      if (uVar4 <= uVar2) {
        uVar2 = uVar4;
      }
      if (uVar1 < 5000) {
        sVar3 = uVar2 + uVar1;
      }
      else {
        std::
        vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
        ::_M_erase(&(this->queue).storage,__first,__first._M_current + uVar1 + uVar2);
        sVar3 = 0;
      }
      (this->queue).m_offset = sVar3;
    }
    else {
      this->markerOffset = this->markerOffset + this->numToConsume;
    }
    this->numToConsume = 0;
  }
  this->nMarkers = this->nMarkers + 1;
  return this->markerOffset;
}

Assistant:

unsigned int TokenBuffer::mark()
{
	syncConsume();
	nMarkers++;
	return markerOffset;
}